

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

void nni_dialer_rele(nni_dialer *d)

{
  int *piVar1;
  _Bool _Var2;
  
  nni_mtx_lock(&dialers_lk);
  if (d->d_ref < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/dialer.c",
              0x16c,"d->d_ref > 0");
  }
  piVar1 = &d->d_ref;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    nni_mtx_unlock(&dialers_lk);
    return;
  }
  _Var2 = d->d_closed;
  nni_mtx_unlock(&dialers_lk);
  if (_Var2 == true) {
    nni_dialer_reap(d);
    return;
  }
  return;
}

Assistant:

void
nni_dialer_rele(nni_dialer *d)
{
	bool reap;

	nni_mtx_lock(&dialers_lk);
	NNI_ASSERT(d->d_ref > 0);
	d->d_ref--;
	reap = ((d->d_ref == 0) && (d->d_closed));
	nni_mtx_unlock(&dialers_lk);

	if (reap) {
		nni_dialer_reap(d);
	}
}